

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,void *dst,size_t minBytes,size_t maxBytes)

{
  byte bVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  bool bVar5;
  PackedInputStream *pPVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  byte bVar10;
  uint uVar11;
  size_t extraout_RDX;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  size_t sVar15;
  ulong uVar16;
  byte *__dest;
  uchar *__n;
  long lVar17;
  size_t __n_00;
  uchar *__n_01;
  void *__buf;
  size_t unaff_R14;
  ulong uVar18;
  long lVar19;
  ArrayPtr<const_unsigned_char> AVar20;
  ArrayPtr<const_unsigned_char> AVar21;
  Fault f;
  byte *local_78;
  Fault local_68;
  byte *local_60;
  PackedInputStream *local_58;
  byte *local_50;
  byte *local_48;
  ulong local_40;
  long local_38;
  uchar *puVar9;
  
  if (maxBytes != 0) {
    local_50 = (byte *)maxBytes;
    iVar7 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
    puVar9 = (uchar *)CONCAT44(extraout_var,iVar7);
    AVar21.size_ = extraout_RDX;
    AVar21.ptr = puVar9;
    if (extraout_RDX != 0) {
      local_60 = local_50 + (long)dst;
      pbVar14 = (byte *)(minBytes + (long)dst);
      local_38 = -(long)dst;
      __dest = (byte *)dst;
      local_58 = this;
      local_48 = pbVar14;
      do {
        sVar15 = AVar21.size_;
        pbVar12 = AVar21.ptr;
        pbVar13 = puVar9 + sVar15;
        if ((ulong)((long)pbVar13 - (long)pbVar12) < 10) {
          if (__dest < pbVar14) {
            if (pbVar13 == pbVar12) {
              (*(this->inner->super_InputStream)._vptr_InputStream[3])();
              AVar21 = kj::BufferedInputStream::getReadBuffer(this->inner);
              AVar3.size_ = unaff_R14;
              AVar3.ptr = AVar21.ptr;
              iVar7 = 7;
              if (AVar21.size_ == 0) {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                          (&local_68,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                           ,0x4d,FAILED,"buffer.size() > 0","\"Premature end of packed input.\"",
                           (char (*) [31])"Premature end of packed input.");
                local_78 = __dest + -(long)dst;
                kj::_::Debug::Fault::~Fault(&local_68);
                AVar3 = AVar21;
                goto LAB_0020eb7c;
              }
            }
            else {
              bVar1 = *pbVar12;
              local_40 = CONCAT71((int7)((ulong)pbVar13 >> 8),bVar1);
              pbVar12 = pbVar12 + 1;
              lVar19 = 0;
              lVar17 = 0;
              uVar16 = 0;
              do {
                pPVar6 = local_58;
                AVar20.size_ = sVar15;
                AVar20.ptr = pbVar12;
                if ((bVar1 >> ((uint)lVar19 & 0x1f) & 1) == 0) {
                  bVar10 = 0;
                }
                else {
                  if (puVar9 + sVar15 == pbVar12) {
                    (*(local_58->inner->super_InputStream)._vptr_InputStream[3])();
                    AVar20 = kj::BufferedInputStream::getReadBuffer(pPVar6->inner);
                    puVar9 = AVar20.ptr;
                    if (AVar20.size_ == 0) {
                      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                                (&local_68,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                                 ,0x59,FAILED,"buffer.size() > 0",
                                 "\"Premature end of packed input.\"",
                                 (char (*) [31])"Premature end of packed input.");
                      local_78 = __dest + (local_38 - lVar17);
                      kj::_::Debug::Fault::~Fault(&local_68);
                      iVar7 = 1;
                      goto LAB_0020e9b0;
                    }
                  }
                  sVar15 = AVar20.size_;
                  bVar10 = *AVar20.ptr;
                  pbVar12 = AVar20.ptr + 1;
                }
                AVar20.size_ = sVar15;
                AVar20.ptr = puVar9;
                __dest[lVar19] = bVar10;
                uVar16 = (ulong)(6 < (uint)lVar19);
                lVar17 = lVar17 + -1;
                lVar19 = lVar19 + 1;
              } while ((int)lVar19 != 8);
              iVar7 = 0xd;
LAB_0020e9b0:
              uVar18 = local_40;
              pbVar14 = local_48;
              this = local_58;
              __dest = __dest + -lVar17;
              sVar15 = AVar20.size_;
              puVar9 = AVar20.ptr;
              AVar3.size_ = uVar16;
              AVar3.ptr = puVar9;
              AVar21.size_ = sVar15;
              AVar21.ptr = pbVar12;
              AVar2.size_ = sVar15;
              AVar2.ptr = pbVar12;
              if (uVar16 != 0) {
                if ((puVar9 + sVar15 == pbVar12) &&
                   (AVar21 = AVar2, (byte)((char)local_40 + 1U) < 2)) {
                  (*(local_58->inner->super_InputStream)._vptr_InputStream[3])();
                  AVar21 = kj::BufferedInputStream::getReadBuffer(this->inner);
                  puVar9 = AVar21.ptr;
                  AVar3.size_ = (size_t)pbVar14;
                  AVar3.ptr = puVar9;
                  if (AVar21.size_ == 0) {
                    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                              (&local_68,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                               ,0x62,FAILED,"buffer.size() > 0","\"Premature end of packed input.\""
                               ,(char (*) [31])"Premature end of packed input.");
                    local_78 = __dest + -(long)dst;
                    kj::_::Debug::Fault::~Fault(&local_68);
                    AVar21.size_ = 0;
                    AVar21.ptr = __dest;
                    goto LAB_0020eb7c;
                  }
                }
                goto LAB_0020eae8;
              }
            }
          }
          else {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])();
            AVar3.size_ = sVar15;
            AVar3.ptr = puVar9;
            AVar21.size_ = sVar15;
            AVar21.ptr = puVar9;
            local_78 = __dest + -(long)dst;
LAB_0020eb7c:
            AVar21.size_ = AVar21.size_;
            AVar21.ptr = pbVar12;
            iVar7 = 1;
          }
        }
        else {
          bVar1 = *pbVar12;
          uVar18 = (ulong)bVar1;
          bVar10 = pbVar12[1];
          if ((bVar1 & 1) == 0) {
            bVar10 = 0;
          }
          *__dest = bVar10;
          lVar17 = (ulong)(bVar1 & 1) + 1;
          uVar11 = bVar1 >> 1 & 1;
          __dest[1] = -(char)uVar11 & pbVar12[(ulong)(bVar1 & 1) + 1];
          uVar8 = bVar1 >> 2 & 1;
          lVar19 = (ulong)uVar11 + lVar17;
          __dest[2] = -(char)uVar8 & pbVar12[(ulong)uVar11 + lVar17];
          lVar17 = (ulong)uVar8 + lVar19;
          uVar11 = bVar1 >> 3 & 1;
          __dest[3] = -(char)uVar11 & pbVar12[(ulong)uVar8 + lVar19];
          lVar19 = (ulong)uVar11 + lVar17;
          uVar8 = bVar1 >> 4 & 1;
          __dest[4] = -(char)uVar8 & pbVar12[(ulong)uVar11 + lVar17];
          lVar17 = (ulong)uVar8 + lVar19;
          uVar11 = bVar1 >> 5 & 1;
          __dest[5] = -(char)uVar11 & pbVar12[(ulong)uVar8 + lVar19];
          uVar8 = bVar1 >> 6 & 1;
          lVar19 = (ulong)uVar11 + lVar17;
          __dest[6] = -(char)uVar8 & pbVar12[(ulong)uVar11 + lVar17];
          __dest[7] = (char)bVar1 >> 7 & pbVar12[(ulong)uVar8 + lVar19];
          __dest = __dest + 8;
          AVar21.size_ = sVar15;
          AVar21.ptr = pbVar12 + (ulong)(bVar1 >> 7) + (ulong)uVar8 + lVar19;
LAB_0020eae8:
          uVar16 = AVar21.size_;
          pbVar13 = AVar21.ptr;
          if ((char)uVar18 == -1) {
            pbVar14 = pbVar13 + 1;
            __n_01 = (uchar *)((ulong)*pbVar13 * 8);
            if ((long)local_60 - (long)__dest < (long)__n_01) {
              bVar5 = false;
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                        (&local_68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x8b,FAILED,"runLength <= outEnd - out",
                         "\"Packed input did not end cleanly on a segment boundary.\"",
                         (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
              local_78 = __dest + -(long)dst;
              kj::_::Debug::Fault::~Fault(&local_68);
              AVar21.size_ = uVar16;
              AVar21.ptr = pbVar14;
              iVar7 = 1;
            }
            else {
              __n = puVar9 + (uVar16 - (long)pbVar14);
              if (__n < __n_01) {
                memcpy(__dest,pbVar14,(size_t)__n);
                __buf = (void *)(ulong)(uint)((int)__n_01 - (int)__n);
                (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,uVar16);
                kj::InputStream::read
                          (&this->inner->super_InputStream,(int)(__dest + (long)__n),__buf,
                           (size_t)__buf);
                __dest = __dest + (long)__n + (long)__buf;
                if (__dest != local_60) {
                  AVar21 = kj::BufferedInputStream::getReadBuffer(this->inner);
                  puVar9 = AVar21.ptr;
                  iVar7 = 7;
                  bVar5 = false;
                  goto LAB_0020ec7d;
                }
                iVar7 = 1;
                bVar5 = false;
                local_78 = local_50;
              }
              else {
                memcpy(__dest,pbVar14,(size_t)__n_01);
                __dest = __dest + (long)__n_01;
                pbVar14 = pbVar14 + (long)__n_01;
                iVar7 = 0;
                bVar5 = true;
              }
              AVar21.size_ = uVar16;
              AVar21.ptr = pbVar14;
            }
LAB_0020ec7d:
            AVar3.size_ = uVar16;
            AVar3.ptr = puVar9;
            pbVar14 = local_48;
            this = local_58;
            uVar18 = uVar16;
            if (!bVar5) goto LAB_0020ecc0;
          }
          else if ((uVar18 & 0xff) == 0) {
            __n_00 = (ulong)*pbVar13 * 8;
            uVar18 = (long)local_60 - (long)__dest;
            AVar3.size_ = uVar18;
            AVar3.ptr = puVar9;
            if ((long)uVar18 < (long)__n_00) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                        (&local_68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x7f,FAILED,"runLength <= outEnd - out",
                         "\"Packed input did not end cleanly on a segment boundary.\"",
                         (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
              local_78 = __dest + -(long)dst;
              kj::_::Debug::Fault::~Fault(&local_68);
            }
            else {
              memset(__dest,0,__n_00);
              __dest = __dest + __n_00;
            }
            AVar21.size_ = uVar16;
            AVar21.ptr = pbVar13 + 1;
            iVar7 = 1;
            pbVar14 = local_48;
            this = local_58;
            if ((long)uVar18 < (long)__n_00) goto LAB_0020ecc0;
          }
          AVar3.size_ = uVar18;
          AVar3.ptr = puVar9;
          AVar4.size_ = AVar21.size_;
          AVar4.ptr = puVar9;
          iVar7 = 0;
          if (__dest == local_60) {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])();
            iVar7 = 1;
            local_78 = local_50;
            AVar3 = AVar4;
          }
        }
LAB_0020ecc0:
        unaff_R14 = AVar3.size_;
        puVar9 = AVar3.ptr;
        if ((iVar7 != 0) && (iVar7 != 7)) {
          return (size_t)local_78;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

size_t PackedInputStream::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(dst);
  uint8_t* const outEnd = reinterpret_cast<uint8_t*>(dst) + maxBytes;
  uint8_t* const outMin = reinterpret_cast<uint8_t*>(dst) + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - reinterpret_cast<uint8_t*>(dst); \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - reinterpret_cast<uint8_t*>(dst)) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - reinterpret_cast<uint8_t*>(dst);
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(out, runLength);
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}